

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexWriter.cpp
# Opt level: O0

void __thiscall Ptex::v2_4::PtexMainWriter::finish(PtexMainWriter *this)

{
  FILE *src;
  FilePos pos;
  FaceInfo *pFVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t size_00;
  reference pvVar6;
  PtexFaceData *pPVar7;
  undefined4 extraout_var;
  void *pvVar8;
  size_type sVar9;
  char *__filename;
  FILE *__stream;
  reference data_00;
  FILE *fp;
  reference pvVar10;
  reference this_00;
  reference pvVar11;
  reference pvVar12;
  vector<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_> *this_01;
  PtexWriterBase *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_02;
  char *in_stack_00000020;
  char *in_stack_00000028;
  int fi;
  int nfaces_2;
  LevelRec *level;
  LevelInfo *info_1;
  int li;
  vector<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_> levelinfo;
  FilePos levelInfoPos;
  FILE *newfp;
  int nfaces_1;
  int i_1;
  char *data_1;
  PtexPtr<Ptex::v2_4::PtexFaceData> data;
  int size;
  FaceInfo *info;
  int nfaces;
  int i;
  string *in_stack_fffffffffffffe68;
  PtexWriterBase *in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe7c;
  allocator_type *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  vector<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_> *in_stack_fffffffffffffe90;
  FILE *dst;
  FILE *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  uint32_t in_stack_fffffffffffffebc;
  FILE *fp_00;
  PtexWriterBase *this_03;
  PtexMainWriter *in_stack_fffffffffffffef0;
  int local_b0;
  int local_98;
  vector<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_> local_90;
  PtexMainWriter *in_stack_ffffffffffffff90;
  PtexMainWriter *in_stack_ffffffffffffffa0;
  int local_44;
  PtexPtr<Ptex::v2_4::PtexFaceData> local_28;
  int local_1c;
  FaceInfo *local_18;
  uint32_t local_10;
  uint local_c;
  
  if ((in_RDI[1]._path.field_2._M_local_buf[8] & 1U) != 0) {
    if (*(long *)&in_RDI[1]._pixelSize == 0) {
      local_44 = 0;
      uVar5 = (in_RDI->_header).nfaces;
      for (; local_44 < (int)uVar5; local_44 = local_44 + 1) {
        pvVar6 = std::vector<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>::
                 operator[]((vector<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_> *)
                            &in_RDI[1]._tilepath,(long)local_44);
        if (pvVar6->flags == 0xff) {
          pvVar6 = std::vector<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>::
                   operator[]((vector<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_> *
                              )&in_RDI[1]._tilepath,(long)local_44);
          pvVar6->flags = '\x01';
        }
      }
    }
    else {
      local_c = 0;
      local_10 = (in_RDI->_header).nfaces;
      for (; (int)local_c < (int)local_10; local_c = local_c + 1) {
        pvVar6 = std::vector<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>::
                 operator[]((vector<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_> *)
                            &in_RDI[1]._tilepath,(long)(int)local_c);
        if (pvVar6->flags == 0xff) {
          local_18 = (FaceInfo *)
                     (**(code **)(**(long **)&in_RDI[1]._pixelSize + 0x80))
                               (*(long **)&in_RDI[1]._pixelSize,local_c);
          iVar4 = in_RDI->_pixelSize;
          local_1c = Res::size((Res *)in_stack_fffffffffffffe70);
          local_1c = iVar4 * local_1c;
          bVar3 = FaceInfo::isConstant(local_18);
          if (bVar3) {
            pPVar7 = (PtexFaceData *)
                     (**(code **)(**(long **)&in_RDI[1]._pixelSize + 0x98))
                               (*(long **)&in_RDI[1]._pixelSize,local_c);
            PtexPtr<Ptex::v2_4::PtexFaceData>::PtexPtr(&local_28,pPVar7);
            pPVar7 = PtexPtr::operator_cast_to_PtexFaceData_((PtexPtr *)&local_28);
            uVar2 = local_c;
            pFVar1 = local_18;
            if (pPVar7 != (PtexFaceData *)0x0) {
              pPVar7 = PtexPtr<Ptex::v2_4::PtexFaceData>::operator->(&local_28);
              iVar4 = (*pPVar7->_vptr_PtexFaceData[6])();
              (*(in_RDI->super_PtexWriter)._vptr_PtexWriter[0xd])
                        (in_RDI,(ulong)uVar2,pFVar1,CONCAT44(extraout_var,iVar4));
            }
            PtexPtr<Ptex::v2_4::PtexFaceData>::~PtexPtr
                      ((PtexPtr<Ptex::v2_4::PtexFaceData> *)in_stack_fffffffffffffe70);
          }
          else {
            pvVar8 = operator_new__((long)local_1c);
            (**(code **)(**(long **)&in_RDI[1]._pixelSize + 0x88))
                      (*(long **)&in_RDI[1]._pixelSize,local_c,pvVar8,0);
            (*(in_RDI->super_PtexWriter)._vptr_PtexWriter[0xc])
                      (in_RDI,(ulong)local_c,local_18,pvVar8,0);
            if (pvVar8 != (void *)0x0) {
              operator_delete__(pvVar8);
            }
          }
        }
      }
    }
    if ((in_RDI[1]._path.field_2._M_local_buf[9] & 1U) != 0) {
      generateReductions(in_stack_ffffffffffffffa0);
    }
    flagConstantNeighorhoods(in_stack_fffffffffffffef0);
    sVar9 = std::
            vector<Ptex::v2_4::PtexMainWriter::LevelRec,_std::allocator<Ptex::v2_4::PtexMainWriter::LevelRec>_>
            ::size((vector<Ptex::v2_4::PtexMainWriter::LevelRec,_std::allocator<Ptex::v2_4::PtexMainWriter::LevelRec>_>
                    *)&in_RDI[1]._header.metadatazipsize);
    (in_RDI->_header).nlevels = (uint16_t)sVar9;
    sVar9 = std::vector<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>::size
                      ((vector<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_> *)
                       &in_RDI[1]._tilepath);
    (in_RDI->_header).nfaces = (uint32_t)sVar9;
    __filename = (char *)std::__cxx11::string::c_str();
    __stream = fopen(__filename,"wb+");
    if (__stream == (FILE *)0x0) {
      std::__cxx11::string::c_str();
      (anonymous_namespace)::fileError_abi_cxx11_(in_stack_00000028,in_stack_00000020);
      PtexWriterBase::setError(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    }
    else {
      PtexWriterBase::writeBlank
                ((PtexWriterBase *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 (FILE *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
      PtexWriterBase::writeBlank
                ((PtexWriterBase *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 (FILE *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
      this_03 = (PtexWriterBase *)0x0;
      fp_00 = __stream;
      pvVar6 = std::vector<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>::operator[]
                         ((vector<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_> *)
                          &in_RDI[1]._tilepath,0);
      uVar5 = PtexWriterBase::writeZipBlock
                        (in_RDI,(FILE *)fp_00,pvVar6,(in_RDI->_header).nfaces * 0x14,true);
      (in_RDI->_header).faceinfosize = uVar5;
      this_02 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                ((long)&in_RDI[1]._tilepath.field_2 + 8);
      data_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          (this_02,(size_type)this_03);
      sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_02);
      uVar5 = PtexWriterBase::writeZipBlock(in_RDI,(FILE *)__stream,data_00,(int)sVar9,true);
      (in_RDI->_header).constdatasize = uVar5;
      fp = (FILE *)ftello(__stream);
      PtexWriterBase::writeBlank
                ((PtexWriterBase *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 (FILE *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
      std::allocator<Ptex::v2_4::LevelInfo>::allocator((allocator<Ptex::v2_4::LevelInfo> *)0x128965)
      ;
      std::vector<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_>::vector
                (in_stack_fffffffffffffe90,
                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 in_stack_fffffffffffffe80);
      std::allocator<Ptex::v2_4::LevelInfo>::~allocator
                ((allocator<Ptex::v2_4::LevelInfo> *)0x128991);
      for (local_98 = 0; iVar4 = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
          local_98 < (int)(uint)(in_RDI->_header).nlevels; local_98 = local_98 + 1) {
        pvVar10 = std::vector<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_>::
                  operator[](&local_90,(long)local_98);
        this_00 = std::
                  vector<Ptex::v2_4::PtexMainWriter::LevelRec,_std::allocator<Ptex::v2_4::PtexMainWriter::LevelRec>_>
                  ::operator[]((vector<Ptex::v2_4::PtexMainWriter::LevelRec,_std::allocator<Ptex::v2_4::PtexMainWriter::LevelRec>_>
                                *)&in_RDI[1]._header.metadatazipsize,(long)local_98);
        sVar9 = std::vector<Ptex::v2_4::FaceDataHeader,_std::allocator<Ptex::v2_4::FaceDataHeader>_>
                ::size(&this_00->fdh);
        uVar5 = (uint32_t)sVar9;
        pvVar10->nfaces = uVar5;
        in_stack_fffffffffffffeb0 = __stream;
        pvVar11 = std::
                  vector<Ptex::v2_4::FaceDataHeader,_std::allocator<Ptex::v2_4::FaceDataHeader>_>::
                  operator[](&this_00->fdh,0);
        in_stack_fffffffffffffebc =
             PtexWriterBase::writeZipBlock
                       (in_RDI,(FILE *)in_stack_fffffffffffffeb0,pvVar11,uVar5 << 2,true);
        pvVar10->levelheadersize = in_stack_fffffffffffffebc;
        pvVar10->leveldatasize = (ulong)pvVar10->levelheadersize;
        for (local_b0 = 0; local_b0 < (int)uVar5; local_b0 = local_b0 + 1) {
          src = (FILE *)in_RDI[1]._path.field_2._M_allocated_capacity;
          dst = __stream;
          pvVar12 = std::vector<long,_std::allocator<long>_>::operator[]
                              (&this_00->pos,(long)local_b0);
          pos = *pvVar12;
          pvVar11 = std::
                    vector<Ptex::v2_4::FaceDataHeader,_std::allocator<Ptex::v2_4::FaceDataHeader>_>
                    ::operator[](&this_00->fdh,(long)local_b0);
          size_00 = FaceDataHeader::blocksize(pvVar11);
          iVar4 = PtexWriterBase::copyBlock(in_RDI,(FILE *)dst,src,pos,size_00);
          pvVar10->leveldatasize = (long)iVar4 + pvVar10->leveldatasize;
        }
        (in_RDI->_header).leveldatasize = pvVar10->leveldatasize + (in_RDI->_header).leveldatasize;
      }
      rewind((FILE *)in_RDI[1]._path.field_2._M_allocated_capacity);
      bVar3 = std::
              vector<Ptex::v2_4::PtexWriterBase::MetaEntry,_std::allocator<Ptex::v2_4::PtexWriterBase::MetaEntry>_>
              ::empty((vector<Ptex::v2_4::PtexWriterBase::MetaEntry,_std::allocator<Ptex::v2_4::PtexWriterBase::MetaEntry>_>
                       *)in_stack_fffffffffffffe80);
      if (!bVar3) {
        writeMetaData(in_stack_ffffffffffffff90,fp);
      }
      this_01 = (vector<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_> *)
                ftello(__stream);
      (in_RDI->_extheader).editdatapos = (uint64_t)this_01;
      fseeko(__stream,(__off_t)fp,0);
      std::vector<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_>::operator[]
                (&local_90,0);
      uVar5 = PtexWriterBase::writeBlock
                        (this_03,(FILE *)fp_00,
                         (void *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),iVar4
                        );
      (in_RDI->_header).levelinfosize = uVar5;
      fseeko(__stream,0,0);
      PtexWriterBase::writeBlock
                (this_03,(FILE *)fp_00,
                 (void *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),iVar4);
      PtexWriterBase::writeBlock
                (this_03,(FILE *)fp_00,
                 (void *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),iVar4);
      fclose(__stream);
      std::vector<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_>::~vector(this_01);
    }
  }
  return;
}

Assistant:

void PtexMainWriter::finish()
{
    // do nothing if there's no new data to write
    if (!_hasNewData) return;

    // copy missing faces from _reader
    if (_reader) {
        for (int i = 0, nfaces = _header.nfaces; i < nfaces; i++) {
            if (_faceinfo[i].flags == uint8_t(-1)) {
                // copy face data
                const Ptex::FaceInfo& info = _reader->getFaceInfo(i);
                int size = _pixelSize * info.res.size();
                if (info.isConstant()) {
                    PtexPtr<PtexFaceData> data ( _reader->getData(i) );
                    if (data) {
                        writeConstantFace(i, info, data->getData());
                    }
                } else {
                    char* data = new char [size];
                    _reader->getData(i, data, 0);
                    writeFace(i, info, data, 0);
                    delete [] data;
                }
            }
        }
    }
    else {
        // just flag missing faces as constant (black)
        for (int i = 0, nfaces = _header.nfaces; i < nfaces; i++) {
            if (_faceinfo[i].flags == uint8_t(-1))
                _faceinfo[i].flags = FaceInfo::flag_constant;
        }
    }

    // write reductions to tmp file
    if (_genmipmaps)
        generateReductions();

    // flag faces w/ constant neighborhoods
    flagConstantNeighorhoods();

    // update header
    _header.nlevels = uint16_t(_levels.size());
    _header.nfaces = uint32_t(_faceinfo.size());

    // create new file
    FILE* newfp = fopen(_newpath.c_str(), "wb+");
    if (!newfp) {
        setError(fileError("Can't write to ptex file: ", _newpath.c_str()));
        return;
    }

    // write blank header (to fill in later)
    writeBlank(newfp, HeaderSize);
    writeBlank(newfp, ExtHeaderSize);

    // write compressed face info block
    _header.faceinfosize = writeZipBlock(newfp, &_faceinfo[0],
                                         (int)sizeof(FaceInfo)*_header.nfaces);

    // write compressed const data block
    _header.constdatasize = writeZipBlock(newfp, &_constdata[0], int(_constdata.size()));

    // write blank level info block (to fill in later)
    FilePos levelInfoPos = ftello(newfp);
    writeBlank(newfp, LevelInfoSize * _header.nlevels);

    // write level data blocks (and record level info)
    std::vector<LevelInfo> levelinfo(_header.nlevels);
    for (int li = 0; li < _header.nlevels; li++)
    {
        LevelInfo& info = levelinfo[li];
        LevelRec& level = _levels[li];
        int nfaces = int(level.fdh.size());
        info.nfaces = nfaces;
        // output compressed level data header
        info.levelheadersize = writeZipBlock(newfp, &level.fdh[0],
                                             (int)sizeof(FaceDataHeader)*nfaces);
        info.leveldatasize = info.levelheadersize;
        // copy level data from tmp file
        for (int fi = 0; fi < nfaces; fi++)
            info.leveldatasize += copyBlock(newfp, _tmpfp, level.pos[fi],
                                            level.fdh[fi].blocksize());
        _header.leveldatasize += info.leveldatasize;
    }
    rewind(_tmpfp);

    // write meta data (if any)
    if (!_metadata.empty())
        writeMetaData(newfp);

    // update extheader for edit data position
    _extheader.editdatapos = ftello(newfp);

    // rewrite level info block
    fseeko(newfp, levelInfoPos, SEEK_SET);
    _header.levelinfosize = writeBlock(newfp, &levelinfo[0], LevelInfoSize*_header.nlevels);

    // rewrite header
    fseeko(newfp, 0, SEEK_SET);
    writeBlock(newfp, &_header, HeaderSize);
    writeBlock(newfp, &_extheader, ExtHeaderSize);
    fclose(newfp);
}